

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dictionary.h
# Opt level: O0

int __thiscall
JsUtil::
WeaklyReferencedKeyDictionary<const_Js::FunctionBody,_Js::ScriptContext::RejitStats_*,_DefaultComparer<const_Js::FunctionBody_*>,_true>
::RemoveEntry(WeaklyReferencedKeyDictionary<const_Js::FunctionBody,_Js::ScriptContext::RejitStats_*,_DefaultComparer<const_Js::FunctionBody_*>,_true>
              *this,int i,int previous,uint bucket)

{
  int iVar1;
  Type p_Var2;
  WeakRefDictionaryEntry<const_Js::FunctionBody,_Memory::WriteBarrierPtr<Js::ScriptContext::RejitStats>_>
  *pWVar3;
  WeakRefDictionaryEntry<const_Js::FunctionBody,_Memory::WriteBarrierPtr<Js::ScriptContext::RejitStats>_>
  **ppWVar4;
  int **ppiVar5;
  void **ppvVar6;
  long lVar7;
  nullptr_t local_28;
  int local_20;
  uint local_1c;
  int next;
  uint bucket_local;
  int previous_local;
  int i_local;
  WeaklyReferencedKeyDictionary<const_Js::FunctionBody,_Js::ScriptContext::RejitStats_*,_DefaultComparer<const_Js::FunctionBody_*>,_true>
  *this_local;
  
  local_1c = bucket;
  next = previous;
  bucket_local = i;
  _previous_local = this;
  ppWVar4 = Memory::WriteBarrierPtr::operator_cast_to_WeakRefDictionaryEntry__
                      ((WriteBarrierPtr *)&this->entries);
  local_20 = (*ppWVar4)[(int)bucket_local].next;
  if (next < 0) {
    ppWVar4 = Memory::WriteBarrierPtr::operator_cast_to_WeakRefDictionaryEntry__
                        ((WriteBarrierPtr *)&this->entries);
    iVar1 = (*ppWVar4)[(int)bucket_local].next;
    ppiVar5 = Memory::WriteBarrierPtr::operator_cast_to_int__((WriteBarrierPtr *)&this->buckets);
    (*ppiVar5)[local_1c] = iVar1;
  }
  else {
    ppWVar4 = Memory::WriteBarrierPtr::operator_cast_to_WeakRefDictionaryEntry__
                        ((WriteBarrierPtr *)&this->entries);
    iVar1 = (*ppWVar4)[(int)bucket_local].next;
    ppWVar4 = Memory::WriteBarrierPtr::operator_cast_to_WeakRefDictionaryEntry__
                        ((WriteBarrierPtr *)&this->entries);
    (*ppWVar4)[next].next = iVar1;
  }
  if ((this->entryRemovalCallback).fnCallback != (Type)0x0) {
    p_Var2 = (this->entryRemovalCallback).fnCallback;
    ppWVar4 = Memory::WriteBarrierPtr::operator_cast_to_WeakRefDictionaryEntry__
                        ((WriteBarrierPtr *)&this->entries);
    pWVar3 = *ppWVar4;
    lVar7 = (long)(int)bucket_local;
    ppvVar6 = Memory::WriteBarrierPtr::operator_cast_to_void__
                        ((WriteBarrierPtr *)&(this->entryRemovalCallback).cookie);
    (*p_Var2)(pWVar3 + lVar7,*ppvVar6);
  }
  iVar1 = this->freeList;
  ppWVar4 = Memory::WriteBarrierPtr::operator_cast_to_WeakRefDictionaryEntry__
                      ((WriteBarrierPtr *)&this->entries);
  (*ppWVar4)[(int)bucket_local].next = iVar1;
  local_28 = (nullptr_t)0x0;
  ppWVar4 = Memory::WriteBarrierPtr::operator_cast_to_WeakRefDictionaryEntry__
                      ((WriteBarrierPtr *)&this->entries);
  Memory::WriteBarrierPtr<const_Memory::RecyclerWeakReference<const_Js::FunctionBody>_>::operator=
            (&(*ppWVar4)[(int)bucket_local].key,&local_28);
  ppWVar4 = Memory::WriteBarrierPtr::operator_cast_to_WeakRefDictionaryEntry__
                      ((WriteBarrierPtr *)&this->entries);
  (*ppWVar4)[(int)bucket_local].hash = 0;
  this->freeList = bucket_local;
  this->freeCount = this->freeCount + 1;
  this->version = this->version + 1;
  return local_20;
}

Assistant:

int RemoveEntry(int i, int previous, uint bucket)
        {
            int next = entries[i].next;

            if (previous < 0) // Previous < 0 => first node
            {
                buckets[bucket] = entries[i].next;
            }
            else
            {
                entries[previous].next = entries[i].next;
            }

            if (this->entryRemovalCallback.fnCallback != nullptr)
            {
                this->entryRemovalCallback.fnCallback(entries[i], this->entryRemovalCallback.cookie);
            }

            entries[i].next = freeList;
            entries[i].key = nullptr;
            entries[i].hash = EntryType::INVALID_HASH_VALUE;
            // Hold onto the pid here so that we can reuse it
            // entries[i].value = nullptr;
            freeList = i;
            freeCount++;
            version++;

            return next;
        }